

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

int VP8EncTokenLoop(VP8Encoder *enc)

{
  VP8EncProba *proba;
  VP8TBuffer *b;
  ProbaArray (*probas) [8];
  int iVar1;
  int iVar2;
  VP8RDLevel rd_opt;
  int iVar3;
  float q;
  int iVar4;
  VP8Encoder *enc_00;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int16_t (*paiVar14) [16];
  int16_t (*paiVar15) [16];
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint ok;
  int *piVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  float fVar24;
  double dVar25;
  uint64_t local_1380;
  long local_1378;
  int16_t (*local_1338) [16];
  PassStats local_1310;
  VP8Residual local_12d8;
  VP8ModeScore info;
  VP8EncIterator it;
  
  iVar7 = enc->mb_w;
  iVar1 = enc->mb_h;
  iVar19 = enc->config->pass;
  iVar2 = enc->do_search;
  rd_opt = enc->rd_opt_level;
  InitPassStats(enc,&local_1310);
  iVar5 = PreLoopInitialize(enc);
  if (iVar5 == 0) {
    iVar7 = 0;
  }
  else {
    iVar11 = iVar1 * iVar7 >> 3;
    iVar5 = 0x60;
    if (0x60 < iVar11) {
      iVar5 = iVar11;
    }
    proba = &enc->proba;
    b = &enc->tokens;
    probas = (enc->proba).coeffs;
    iVar11 = 0x28;
    while( true ) {
      iVar4 = local_1310.do_size_search;
      q = local_1310.q;
      fVar24 = ABS(local_1310.dq);
      iVar10 = iVar19 + -1;
      dVar25 = local_1310.value;
      while( true ) {
        iVar6 = local_1310.do_size_search;
        if (iVar19 < 1) goto LAB_0012b2d0;
        bVar22 = true;
        if (iVar10 != 0 && 0.4 < fVar24) {
          bVar22 = enc->max_i4_header_bits == 0;
        }
        iVar6 = iVar11 / (iVar19 + 1);
        VP8IteratorInit(enc,&it);
        SetLoopParams(enc,q);
        if (bVar22) {
          memset((enc->proba).stats,0,0x1080);
          VP8InitFilter(&it);
        }
        iVar11 = iVar11 - iVar6;
        VP8TBufferClear(b);
        local_1378 = 0;
        local_1380 = 0;
        iVar12 = iVar5;
        do {
          VP8IteratorImport(&it,(uint8_t *)0x0);
          if (iVar12 < 1) {
            FinalizeTokenProbas(proba);
            VP8CalculateLevelCosts(proba);
            iVar12 = iVar5;
          }
          else {
            iVar12 = iVar12 + -1;
          }
          VP8Decimate(&it,&info,rd_opt);
          enc_00 = it.enc;
          VP8IteratorNzToBytes(&it);
          bVar23 = ((uint)*it.mb & 3) != 1;
          if (bVar23) {
            iVar13 = 3;
          }
          else {
            iVar13 = it.left_nz[8] + it.top_nz[8];
            VP8InitResidual(0,1,enc_00,&local_12d8);
            (*VP8SetResidualCoeffs)(info.y_dc_levels,&local_12d8);
            it.top_nz[8] = VP8RecordCoeffTokens(iVar13,&local_12d8,b);
            iVar13 = 0;
            it.left_nz[8] = it.top_nz[8];
          }
          VP8InitResidual((uint)!bVar23,iVar13,enc_00,&local_12d8);
          paiVar14 = info.y_ac_levels;
          for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
            paiVar15 = paiVar14;
            for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
              iVar13 = it.left_nz[lVar21];
              iVar3 = it.top_nz[lVar16];
              (*VP8SetResidualCoeffs)(*paiVar15,&local_12d8);
              iVar13 = VP8RecordCoeffTokens(iVar13 + iVar3,&local_12d8,b);
              it.left_nz[lVar21] = iVar13;
              it.top_nz[lVar16] = iVar13;
              paiVar15 = paiVar15 + 1;
            }
            paiVar14 = paiVar14 + 4;
          }
          VP8InitResidual(0,2,enc_00,&local_12d8);
          piVar20 = it.top_nz + 4;
          local_1338 = info.uv_levels;
          for (uVar8 = 0; uVar8 < 3; uVar8 = uVar8 + 2) {
            paiVar14 = local_1338;
            for (uVar18 = 0; uVar18 != 2; uVar18 = uVar18 + 1) {
              uVar17 = uVar18 | uVar8 | 4;
              paiVar15 = paiVar14;
              for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
                iVar13 = it.left_nz[uVar17];
                iVar3 = piVar20[lVar21];
                (*VP8SetResidualCoeffs)(*paiVar15,&local_12d8);
                iVar13 = VP8RecordCoeffTokens(iVar13 + iVar3,&local_12d8,b);
                it.left_nz[uVar17] = iVar13;
                piVar20[lVar21] = iVar13;
                paiVar15 = paiVar15 + 1;
              }
              paiVar14 = paiVar14 + 2;
            }
            local_1338 = local_1338 + 4;
            piVar20 = piVar20 + 2;
          }
          VP8IteratorBytesToNz(&it);
          if ((enc->tokens).error != 0) {
            local_1310.value = dVar25;
            WebPEncodingSetError(enc->pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
            dVar25 = local_1310.value;
            goto LAB_0012b29f;
          }
          local_1378 = local_1378 + info.H;
          local_1380 = local_1380 + info.D;
          if (bVar22) {
            StoreSideInfo(&it);
            VP8StoreFilterStats(&it);
            VP8IteratorExport(&it);
            iVar13 = VP8IteratorProgress(&it,iVar6);
            VP8IteratorSaveBoundary(&it);
            if (iVar13 == 0) goto LAB_0012b29f;
          }
          else {
            VP8IteratorSaveBoundary(&it);
          }
          iVar13 = VP8IteratorNext(&it);
        } while (iVar13 != 0);
        uVar8 = local_1378 + (enc->segment_hdr).size;
        if (iVar4 == 0) {
          dVar25 = GetPSNR(local_1380,(long)iVar7 * (long)iVar1 * 0x180);
        }
        else {
          iVar6 = FinalizeTokenProbas(proba);
          sVar9 = VP8EstimateTokenSize(b,(uint8_t *)probas);
          dVar25 = (double)((sVar9 + (long)iVar6 + uVar8 + 0x400 >> 0xb) + 0x1e);
        }
        if ((enc->max_i4_header_bits < 1) || (uVar8 < 0x3fc00001)) break;
        enc->max_i4_header_bits = (uint)enc->max_i4_header_bits >> 1;
        if (bVar22) {
          if ((it.enc)->pic->stats != (WebPAuxStats *)0x0) {
            (it.enc)->block_count[2] = 0;
            (it.enc)->block_count[0] = 0;
            (it.enc)->block_count[1] = 0;
          }
          (it.enc)->sse_count = 0;
          (it.enc)->sse[0] = 0;
          (it.enc)->sse[1] = 0;
          (it.enc)->sse[2] = 0;
        }
      }
      iVar6 = iVar4;
      if (bVar22) break;
      local_1310.value = dVar25;
      iVar19 = iVar10;
      if (iVar2 != 0) {
        ComputeNextQ(&local_1310);
      }
    }
LAB_0012b2d0:
    local_1310.value = dVar25;
    if (iVar6 == 0) {
      FinalizeTokenProbas(proba);
    }
    iVar7 = VP8EmitTokens(b,enc->parts,(uint8_t *)probas,1);
    dVar25 = local_1310.value;
    if (iVar7 == 0) {
LAB_0012b29f:
      local_1310.value = dVar25;
      ok = 0;
    }
    else {
      iVar7 = WebPReportProgress(enc->pic,iVar11 + enc->percent,&enc->percent);
      ok = (uint)(iVar7 != 0);
    }
    iVar7 = PostLoopFinalize(&it,ok);
  }
  return iVar7;
}

Assistant:

int VP8EncTokenLoop(VP8Encoder* const enc) {
  // Roughly refresh the proba eight times per pass
  int max_count = (enc->mb_w * enc->mb_h) >> 3;
  int num_pass_left = enc->config->pass;
  int remaining_progress = 40;  // percents
  const int do_search = enc->do_search;
  VP8EncIterator it;
  VP8EncProba* const proba = &enc->proba;
  const VP8RDLevel rd_opt = enc->rd_opt_level;
  const uint64_t pixel_count = (uint64_t)enc->mb_w * enc->mb_h * 384;
  PassStats stats;
  int ok;

  InitPassStats(enc, &stats);
  ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  if (max_count < MIN_COUNT) max_count = MIN_COUNT;

  assert(enc->num_parts == 1);
  assert(enc->use_tokens);
  assert(proba->use_skip_proba == 0);
  assert(rd_opt >= RD_OPT_BASIC);   // otherwise, token-buffer won't be useful
  assert(num_pass_left > 0);

  while (ok && num_pass_left-- > 0) {
    const int is_last_pass = (fabs(stats.dq) <= DQ_LIMIT) ||
                             (num_pass_left == 0) ||
                             (enc->max_i4_header_bits == 0);
    uint64_t size_p0 = 0;
    uint64_t distortion = 0;
    int cnt = max_count;
    // The final number of passes is not trivial to know in advance.
    const int pass_progress = remaining_progress / (2 + num_pass_left);
    remaining_progress -= pass_progress;
    VP8IteratorInit(enc, &it);
    SetLoopParams(enc, stats.q);
    if (is_last_pass) {
      ResetTokenStats(enc);
      VP8InitFilter(&it);  // don't collect stats until last pass (too costly)
    }
    VP8TBufferClear(&enc->tokens);
    do {
      VP8ModeScore info;
      VP8IteratorImport(&it, NULL);
      if (--cnt < 0) {
        FinalizeTokenProbas(proba);
        VP8CalculateLevelCosts(proba);  // refresh cost tables for rd-opt
        cnt = max_count;
      }
      VP8Decimate(&it, &info, rd_opt);
      ok = RecordTokens(&it, &info, &enc->tokens);
      if (!ok) {
        WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        break;
      }
      size_p0 += info.H;
      distortion += info.D;
      if (is_last_pass) {
        StoreSideInfo(&it);
        VP8StoreFilterStats(&it);
        VP8IteratorExport(&it);
        ok = VP8IteratorProgress(&it, pass_progress);
      }
      VP8IteratorSaveBoundary(&it);
    } while (ok && VP8IteratorNext(&it));
    if (!ok) break;

    size_p0 += enc->segment_hdr.size;
    if (stats.do_size_search) {
      uint64_t size = FinalizeTokenProbas(&enc->proba);
      size += VP8EstimateTokenSize(&enc->tokens,
                                   (const uint8_t*)proba->coeffs);
      size = (size + size_p0 + 1024) >> 11;  // -> size in bytes
      size += HEADER_SIZE_ESTIMATE;
      stats.value = (double)size;
    } else {  // compute and store PSNR
      stats.value = GetPSNR(distortion, pixel_count);
    }

#if (DEBUG_SEARCH > 0)
    printf("#%2d metric:%.1lf -> %.1lf   last_q=%.2lf q=%.2lf dq=%.2lf "
           " range:[%.1f, %.1f]\n",
           num_pass_left, stats.last_value, stats.value,
           stats.last_q, stats.q, stats.dq, stats.qmin, stats.qmax);
#endif
    if (enc->max_i4_header_bits > 0 && size_p0 > PARTITION0_SIZE_LIMIT) {
      ++num_pass_left;
      enc->max_i4_header_bits >>= 1;  // strengthen header bit limitation...
      if (is_last_pass) {
        ResetSideInfo(&it);
      }
      continue;                        // ...and start over
    }
    if (is_last_pass) {
      break;   // done
    }
    if (do_search) {
      ComputeNextQ(&stats);  // Adjust q
    }
  }
  if (ok) {
    if (!stats.do_size_search) {
      FinalizeTokenProbas(&enc->proba);
    }
    ok = VP8EmitTokens(&enc->tokens, enc->parts + 0,
                       (const uint8_t*)proba->coeffs, 1);
  }
  ok = ok && WebPReportProgress(enc->pic, enc->percent + remaining_progress,
                                &enc->percent);
  return PostLoopFinalize(&it, ok);
}